

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O1

bool __thiscall
Fossilize::StateReplayer::Impl::parse_rasterization_state
          (Impl *this,Value *rs,VkPipelineRasterizationStateCreateInfo **out_info)

{
  double dVar1;
  bool bVar2;
  VkPipelineRasterizationStateCreateInfo *pVVar3;
  Type pGVar4;
  Number NVar5;
  undefined8 local_30;
  
  pVVar3 = (VkPipelineRasterizationStateCreateInfo *)
           ScratchAllocator::allocate_raw(&this->allocator,0x40,0x10);
  if (pVVar3 != (VkPipelineRasterizationStateCreateInfo *)0x0) {
    pVVar3->depthBiasClamp = 0.0;
    pVVar3->depthBiasSlopeFactor = 0.0;
    *(undefined8 *)&pVVar3->lineWidth = 0;
    pVVar3->cullMode = 0;
    pVVar3->frontFace = VK_FRONT_FACE_COUNTER_CLOCKWISE;
    pVVar3->depthBiasEnable = 0;
    pVVar3->depthBiasConstantFactor = 0.0;
    pVVar3->flags = 0;
    pVVar3->depthClampEnable = 0;
    pVVar3->rasterizerDiscardEnable = 0;
    pVVar3->polygonMode = VK_POLYGON_MODE_FILL;
    *(undefined8 *)pVVar3 = 0;
    pVVar3->pNext = (void *)0x0;
  }
  pVVar3->sType = VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_STATE_CREATE_INFO;
  pGVar4 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>
                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       *)rs,"flags");
  if ((undefined1  [16])((undefined1  [16])pGVar4->data_ & (undefined1  [16])0x40000000000000) !=
      (undefined1  [16])0x0) {
    pVVar3->flags = (pGVar4->data_).s.length;
    pGVar4 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>
                       ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                         *)rs,"cullMode");
    if ((undefined1  [16])((undefined1  [16])pGVar4->data_ & (undefined1  [16])0x40000000000000) !=
        (undefined1  [16])0x0) {
      pVVar3->cullMode = (pGVar4->data_).s.length;
      pGVar4 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>
                         ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                           *)rs,"depthBiasClamp");
      dVar1 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::GetDouble(pGVar4);
      pVVar3->depthBiasClamp = (float)dVar1;
      pGVar4 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>
                         ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                           *)rs,"depthBiasConstantFactor");
      dVar1 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::GetDouble(pGVar4);
      pVVar3->depthBiasConstantFactor = (float)dVar1;
      pGVar4 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>
                         ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                           *)rs,"depthBiasSlopeFactor");
      dVar1 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::GetDouble(pGVar4);
      pVVar3->depthBiasSlopeFactor = (float)dVar1;
      pGVar4 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>
                         ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                           *)rs,"lineWidth");
      dVar1 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::GetDouble(pGVar4);
      pVVar3->lineWidth = (float)dVar1;
      pGVar4 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>
                         ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                           *)rs,"rasterizerDiscardEnable");
      if ((undefined1  [16])((undefined1  [16])pGVar4->data_ & (undefined1  [16])0x40000000000000)
          != (undefined1  [16])0x0) {
        pVVar3->rasterizerDiscardEnable = (pGVar4->data_).s.length;
        pGVar4 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                 ::operator[]<char_const>
                           ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                             *)rs,"depthBiasEnable");
        if ((undefined1  [16])((undefined1  [16])pGVar4->data_ & (undefined1  [16])0x40000000000000)
            != (undefined1  [16])0x0) {
          pVVar3->depthBiasEnable = (pGVar4->data_).s.length;
          pGVar4 = rapidjson::
                   GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                   ::operator[]<char_const>
                             ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                               *)rs,"depthClampEnable");
          if ((undefined1  [16])
              ((undefined1  [16])pGVar4->data_ & (undefined1  [16])0x40000000000000) !=
              (undefined1  [16])0x0) {
            pVVar3->depthClampEnable = (pGVar4->data_).s.length;
            pGVar4 = rapidjson::
                     GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                     ::operator[]<char_const>
                               ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                 *)rs,"polygonMode");
            if ((undefined1  [16])
                ((undefined1  [16])pGVar4->data_ & (undefined1  [16])0x40000000000000) !=
                (undefined1  [16])0x0) {
              pVVar3->polygonMode = (pGVar4->data_).s.length;
              pGVar4 = rapidjson::
                       GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       ::operator[]<char_const>
                                 ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                   *)rs,"frontFace");
              if ((undefined1  [16])
                  ((undefined1  [16])pGVar4->data_ & (undefined1  [16])0x40000000000000) !=
                  (undefined1  [16])0x0) {
                pVVar3->frontFace = (pGVar4->data_).s.length;
                rapidjson::
                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                              *)&stack0xffffffffffffffd0,(Ch *)rs);
                NVar5.i = (I)rapidjson::
                             GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                             ::MemberEnd(rs);
                if (local_30 != NVar5.i64) {
                  pGVar4 = rapidjson::
                           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                           ::operator[]<char_const>
                                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                       *)rs,"pNext");
                  bVar2 = parse_pnext_chain(this,pGVar4,&pVVar3->pNext,(StateCreatorInterface *)0x0,
                                            (DatabaseInterface *)0x0,(Value *)0x0);
                  if (!bVar2) {
                    return false;
                  }
                }
                *out_info = pVVar3;
                return true;
              }
            }
          }
        }
      }
    }
  }
  __assert_fail("data_.f.flags & kUintFlag",
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/document.h"
                ,0x719,
                "unsigned int rapidjson::GenericValue<rapidjson::UTF8<>>::GetUint() const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
               );
}

Assistant:

bool StateReplayer::Impl::parse_rasterization_state(const Value &rs, const VkPipelineRasterizationStateCreateInfo **out_info)
{
	auto *state = allocator.allocate_cleared<VkPipelineRasterizationStateCreateInfo>();
	state->sType = VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_STATE_CREATE_INFO;
	state->flags = rs["flags"].GetUint();

	state->cullMode = static_cast<VkCullModeFlags>(rs["cullMode"].GetUint());
	state->depthBiasClamp = rs["depthBiasClamp"].GetFloat();
	state->depthBiasConstantFactor = rs["depthBiasConstantFactor"].GetFloat();
	state->depthBiasSlopeFactor = rs["depthBiasSlopeFactor"].GetFloat();
	state->lineWidth = rs["lineWidth"].GetFloat();
	state->rasterizerDiscardEnable = rs["rasterizerDiscardEnable"].GetUint();
	state->depthBiasEnable = rs["depthBiasEnable"].GetUint();
	state->depthClampEnable = rs["depthClampEnable"].GetUint();
	state->polygonMode = static_cast<VkPolygonMode>(rs["polygonMode"].GetUint());
	state->frontFace = static_cast<VkFrontFace>(rs["frontFace"].GetUint());

	if (rs.HasMember("pNext"))
		if (!parse_pnext_chain(rs["pNext"], &state->pNext))
			return false;

	*out_info = state;
	return true;
}